

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::SliceLayerParams::_InternalSerialize
          (SliceLayerParams *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  void *data;
  bool bVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined8 *puVar8;
  size_t __n;
  
  if (this->startindex_ != 0) {
    puVar3 = target;
    if (stream->end_ <= target) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = this->startindex_;
    *puVar3 = '\b';
    puVar3[1] = (byte)uVar6;
    if (uVar6 < 0x80) {
      target = puVar3 + 2;
    }
    else {
      puVar3[1] = (byte)uVar6 | 0x80;
      puVar3[2] = (uint8_t)(uVar6 >> 7);
      target = puVar3 + 3;
      if (0x3fff < uVar6) {
        uVar7 = (ulong)puVar3[2];
        uVar6 = uVar6 >> 7;
        do {
          target[-1] = (byte)uVar7 | 0x80;
          uVar5 = uVar6 >> 7;
          *target = (uint8_t)uVar5;
          target = target + 1;
          uVar7 = uVar5 & 0xffffffff;
          bVar2 = 0x3fff < uVar6;
          uVar6 = uVar5;
        } while (bVar2);
      }
    }
  }
  puVar3 = target;
  if (this->endindex_ != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = this->endindex_;
    *target = '\x10';
    target[1] = (byte)uVar6;
    if (uVar6 < 0x80) {
      puVar3 = target + 2;
    }
    else {
      target[1] = (byte)uVar6 | 0x80;
      target[2] = (uint8_t)(uVar6 >> 7);
      puVar3 = target + 3;
      if (0x3fff < uVar6) {
        uVar7 = (ulong)target[2];
        uVar6 = uVar6 >> 7;
        do {
          puVar3[-1] = (byte)uVar7 | 0x80;
          uVar5 = uVar6 >> 7;
          *puVar3 = (uint8_t)uVar5;
          puVar3 = puVar3 + 1;
          uVar7 = uVar5 & 0xffffffff;
          bVar2 = 0x3fff < uVar6;
          uVar6 = uVar5;
        } while (bVar2);
      }
    }
  }
  if (this->stride_ != 0) {
    puVar4 = puVar3;
    if (stream->end_ <= puVar3) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar3);
    }
    uVar6 = this->stride_;
    *puVar4 = '\x18';
    puVar4[1] = (byte)uVar6;
    if (uVar6 < 0x80) {
      puVar3 = puVar4 + 2;
    }
    else {
      puVar4[1] = (byte)uVar6 | 0x80;
      puVar4[2] = (uint8_t)(uVar6 >> 7);
      puVar3 = puVar4 + 3;
      if (0x3fff < uVar6) {
        uVar7 = (ulong)puVar4[2];
        uVar6 = uVar6 >> 7;
        do {
          puVar3[-1] = (byte)uVar7 | 0x80;
          uVar5 = uVar6 >> 7;
          *puVar3 = (uint8_t)uVar5;
          puVar3 = puVar3 + 1;
          uVar7 = uVar5 & 0xffffffff;
          bVar2 = 0x3fff < uVar6;
          uVar6 = uVar5;
        } while (bVar2);
      }
    }
  }
  puVar4 = puVar3;
  if (this->axis_ != 0) {
    if (stream->end_ <= puVar3) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar3);
    }
    uVar1 = this->axis_;
    *puVar3 = ' ';
    puVar3[1] = (byte)uVar1;
    if ((ulong)(long)(int)uVar1 < 0x80) {
      puVar4 = puVar3 + 2;
    }
    else {
      puVar3[1] = (byte)uVar1 | 0x80;
      uVar6 = (ulong)(long)(int)uVar1 >> 7;
      puVar3[2] = (uint8_t)uVar6;
      puVar4 = puVar3 + 3;
      if (0x3fff < uVar1) {
        uVar7 = (ulong)puVar3[2];
        do {
          puVar4[-1] = (byte)uVar7 | 0x80;
          uVar5 = uVar6 >> 7;
          *puVar4 = (uint8_t)uVar5;
          puVar4 = puVar4 + 1;
          uVar7 = uVar5 & 0xffffffff;
          bVar2 = 0x3fff < uVar6;
          uVar6 = uVar5;
        } while (bVar2);
      }
    }
  }
  uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar6 & 1) != 0) {
    data = *(void **)((uVar6 & 0xfffffffffffffffc) + 8);
    uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar6 & 1) == 0) {
      puVar8 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar8 = (undefined8 *)((uVar6 & 0xfffffffffffffffc) + 8);
    }
    __n = (size_t)(int)puVar8[1];
    if ((long)stream->end_ - (long)puVar4 < (long)__n) {
      puVar3 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,data,(int)puVar8[1],puVar4);
      return puVar3;
    }
    memcpy(puVar4,data,__n);
    puVar4 = puVar4 + __n;
  }
  return puVar4;
}

Assistant:

uint8_t* SliceLayerParams::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.SliceLayerParams)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 startIndex = 1;
  if (this->_internal_startindex() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(1, this->_internal_startindex(), target);
  }

  // int64 endIndex = 2;
  if (this->_internal_endindex() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(2, this->_internal_endindex(), target);
  }

  // uint64 stride = 3;
  if (this->_internal_stride() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(3, this->_internal_stride(), target);
  }

  // .CoreML.Specification.SliceLayerParams.SliceAxis axis = 4;
  if (this->_internal_axis() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      4, this->_internal_axis(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.SliceLayerParams)
  return target;
}